

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_IncreaseBezierDegree(int dim,bool is_rat,int order,int cv_stride,double *cv)

{
  int iVar1;
  double dVar2;
  int local_64;
  int dcv;
  int cvdim;
  double *newcv;
  int j;
  double c1;
  double c0;
  double d;
  double a1;
  double a0;
  double *cv_local;
  int cv_stride_local;
  int order_local;
  bool is_rat_local;
  int dim_local;
  
  local_64 = dim;
  if (is_rat) {
    local_64 = dim + 1;
  }
  iVar1 = cv_stride - local_64;
  _dcv = cv + cv_stride * order;
  memcpy(_dcv,_dcv + -(long)cv_stride,(long)local_64 << 3);
  _dcv = _dcv + -(long)(iVar1 + 1);
  a0 = (double)(_dcv + -(long)cv_stride);
  a1 = (double)order;
  d = 0.0;
  dVar2 = 1.0 / a1;
  cv_local._4_4_ = order;
  while (cv_local._4_4_ = cv_local._4_4_ + -1, cv_local._4_4_ != 0) {
    a1 = a1 - 1.0;
    d = d + 1.0;
    newcv._4_4_ = local_64;
    while (newcv._4_4_ != 0) {
      *_dcv = dVar2 * a1 * *(double *)a0 + dVar2 * d * *_dcv;
      a0 = (double)((long)a0 + -8);
      _dcv = _dcv + -1;
      newcv._4_4_ = newcv._4_4_ + -1;
    }
    a0 = (double)((long)a0 + (long)iVar1 * -8);
    _dcv = _dcv + -(long)iVar1;
  }
  return true;
}

Assistant:

bool ON_IncreaseBezierDegree(
        int     dim, 
        bool    is_rat, 
        int     order, 
        int     cv_stride,
        double* cv 
        )
/*****************************************************************************
Increase the degree of a Bezier
 
INPUT:
  cvdim (dim + is_rat)
  order ( >= 2 )
    order of input bezier
  cv            
    control vertices of bezier
  newcv    
    array of cvdim*(order+1) doubles (The cv and newcv pointers may be equal.)
OUTPUT:
  newcv  Control vertices of an Bezier with order (order+1).  The new Bezier
         and the old Bezier evaluate to the same point.  
COMMENTS:
  If {B_0, ... B_d} are the control vertices of the input Bezier, then
  {C_0, ..., C_{d+1}} are the control vertices of the returned Bezier, 
  where,
    C_0     = B_0
    C_k     = k/(d+1) * B_{k-1}  +  (d+1-k)/(d+1) * B_{k}(1 < k <= d)
    C_{d+1} = B_d
  The computation is done in a way that permits the pointers cv and newcv
  to be equal; i.e., if the cv array is long enough, the degree may be
  raised with a call like
    TL_IncreaseBezierDegree(cvdim,order,cv,cv);
EXAMPLE:
  raise_degree(TL_BEZIER* bez)
  {  
    // raise the degree of a TL_BEZIER
    bez->cv = (double*) onrealloc ( bez->cv, (bez->order+1)*(bez->dim+bez->is_rat) );
    TL_IncreaseBezierDegree ( bez->dim+bez->is_rat, bez->order,bez->cv,bez->cv );
    bez->order++;
  }
REFERENCE:
  BOHM-01, Page 7.
RELATED FUNCTIONS:
  TL_DecreaseBezierDegree
*****************************************************************************/
{
  double a0, a1, d, c0, c1; 
  int j;
  double* newcv = cv;
  const int cvdim = (is_rat)?dim+1:dim;
  const int dcv = cv_stride - cvdim;


  j = cv_stride*order;
  newcv += j;
  memcpy( newcv, newcv-cv_stride, cvdim*sizeof(*newcv) );
  newcv -= (dcv+1);
  cv = newcv - cv_stride;
  a0 = order;
  a1 = 0.0;
  d = 1.0/a0;
  while (--order) {
    a0 -= 1.0;
    a1 += 1.0;
    c0 = d*a0;
    c1 = d*a1;
    j = cvdim;
    while(j--) {
      *newcv = c0 * *cv + c1 * *newcv; 
      cv--; 
      newcv--;
    }
    cv -= dcv;
    newcv -= dcv;
  }
  return true;
}